

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

void burstsort_brodnik(uchar **strings,size_t n)

{
  TrieNode<unsigned_char> *root;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  
  root = (TrieNode<unsigned_char> *)operator_new(0x820);
  memset(root,0,0x820);
  insert<16000u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<vector_brodnik<unsigned_char*>,void(*)(unsigned_char**,int,int),unsigned_char>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort_brodnik(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_brodnik<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<16000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}